

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

String * __thiscall
kj::anon_unknown_9::DiskHandle::createNamedTemporary
          (String *__return_storage_ptr__,DiskHandle *this,PathPtr finalName,WriteMode mode,
          Function<int_(kj::StringPtr)> *tryCreate)

{
  Disposer *pDVar1;
  PathPtr finalName_00;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  Exception *pEVar6;
  Iface *pIVar7;
  Fault FVar8;
  Function<int_(kj::StringPtr)> *tryCreate_00;
  PathPtr PVar9;
  String path;
  String pathPrefix;
  Fault f_1;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 uVar10;
  undefined1 uVar11;
  String local_a8;
  PathPtr local_88;
  Fault local_78;
  size_t sStack_70;
  ArrayDisposer *local_68;
  Function<int_(kj::StringPtr)> local_60;
  Function<int_(kj::StringPtr)> local_50;
  ArrayPtr<const_kj::String> local_40;
  
  pcVar5 = (char *)finalName.parts.size_;
  local_88.parts.ptr = finalName.parts.ptr;
  local_88.parts.size_ = (size_t)pcVar5;
  if (pcVar5 == (char *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x388,FAILED,(char *)0x0,"\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
    kj::_::Debug::Fault::fatal(&local_78);
  }
  FVar8.exception = (Exception *)this;
  if ((anonymous_namespace)::DiskHandle::
      createNamedTemporary(kj::PathPtr,kj::WriteMode,kj::Function<int(kj::StringPtr)>)::pid == '\0')
  {
    (anonymous_namespace)::DiskHandle::createNamedTemporary();
  }
  local_78.exception = (Exception *)0x0;
  sStack_70 = 0;
  local_68 = (ArrayDisposer *)0x0;
  if ((char *)0x1 < local_88.parts.size_) {
    local_40 = (ArrayPtr<const_kj::String>)PathPtr::parent(&local_88);
    str<kj::PathPtr,char>(&local_a8,(kj *)&local_40,(PathPtr *)&stack0xffffffffffffff56,pcVar5);
    sVar2 = sStack_70;
    FVar8.exception = local_78.exception;
    if (local_78.exception != (Exception *)0x0) {
      local_78.exception = (Exception *)0x0;
      sStack_70 = 0;
      (**local_68->_vptr_ArrayDisposer)(local_68,FVar8.exception,1,sVar2,sVar2,0);
    }
    local_78.exception = (Exception *)local_a8.content.ptr;
    sStack_70 = local_a8.content.size_;
    local_68 = local_a8.content.disposer;
  }
  uVar10 = 0x2e;
  local_40.ptr._0_4_ = createNamedTemporary::counter;
  uVar11 = 0x2e;
  createNamedTemporary::counter = createNamedTemporary::counter + 1;
  pcVar5 = PathPtr::basename(&local_88,(char *)FVar8.exception);
  str<kj::String&,char_const(&)[9],int_const&,char,unsigned_int,char,kj::String_const&,char_const(&)[9]>
            (&local_a8,(kj *)&local_78,(String *)".kj-tmp.",(char (*) [9])&createNamedTemporary::pid
             ,(int *)&stack0xffffffffffffff56,(char *)&local_40,(uint *)&stack0xffffffffffffff57,
             pcVar5,(String *)".partial",
             (char (*) [9])CONCAT17(uVar11,CONCAT16(uVar10,in_stack_ffffffffffffff50)));
  do {
    pEVar6 = (Exception *)0x237f1b;
    if (local_a8.content.size_ != 0) {
      pEVar6 = (Exception *)local_a8.content.ptr;
    }
    pIVar7 = (tryCreate->impl).ptr;
    iVar4 = (**pIVar7->_vptr_Iface)
                      (pIVar7,pEVar6,local_a8.content.size_ + (local_a8.content.size_ == 0));
    if (-1 < iVar4) {
      iVar4 = 0;
      break;
    }
    iVar4 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 == 0) {
    (__return_storage_ptr__->content).ptr = local_a8.content.ptr;
    (__return_storage_ptr__->content).size_ = local_a8.content.size_;
    (__return_storage_ptr__->content).disposer = local_a8.content.disposer;
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
  }
  else {
    if (iVar4 == 2) {
      if (((mode & CREATE_PARENT) == 0) || (local_88.parts.size_ < (char *)0x2)) {
LAB_002098c7:
        kj::_::Debug::Fault::Fault<int,kj::String&>
                  ((Fault *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x3a1,iVar4,"create(path)","path",&local_a8);
        kj::_::Debug::Fault::fatal((Fault *)&local_40);
      }
      PVar9 = PathPtr::parent(&local_88);
      bVar3 = tryMkdir(this,PVar9,CREATE_PARENT|MODIFY|CREATE,true);
      if (!bVar3) goto LAB_002098c7;
      PVar9.parts.size_ = local_88.parts.size_;
      PVar9.parts.ptr = local_88.parts.ptr;
      local_60.impl.disposer = (tryCreate->impl).disposer;
      tryCreate_00 = &local_60;
      local_60.impl.ptr = (tryCreate->impl).ptr;
      (tryCreate->impl).ptr = (Iface *)0x0;
      createNamedTemporary(__return_storage_ptr__,this,PVar9,mode & ~CREATE_PARENT,tryCreate_00);
      pIVar7 = local_60.impl.ptr;
      if (local_60.impl.ptr == (Iface *)0x0) goto LAB_0020985a;
      local_60.impl.ptr = (Iface *)0x0;
    }
    else {
      if (iVar4 != 0x11) goto LAB_002098c7;
      finalName_00.parts.size_ = local_88.parts.size_;
      finalName_00.parts.ptr = local_88.parts.ptr;
      local_50.impl.disposer = (tryCreate->impl).disposer;
      tryCreate_00 = &local_50;
      local_50.impl.ptr = (tryCreate->impl).ptr;
      (tryCreate->impl).ptr = (Iface *)0x0;
      createNamedTemporary(__return_storage_ptr__,this,finalName_00,mode,tryCreate_00);
      pIVar7 = local_50.impl.ptr;
      if (local_50.impl.ptr == (Iface *)0x0) goto LAB_0020985a;
      local_50.impl.ptr = (Iface *)0x0;
    }
    pDVar1 = (tryCreate_00->impl).disposer;
    (**pDVar1->_vptr_Disposer)(pDVar1,pIVar7->_vptr_Iface[-2] + (long)&pIVar7->_vptr_Iface);
  }
LAB_0020985a:
  sVar2 = local_a8.content.size_;
  pcVar5 = local_a8.content.ptr;
  if ((Exception *)local_a8.content.ptr != (Exception *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar5,1,sVar2,sVar2,0);
  }
  sVar2 = sStack_70;
  FVar8.exception = local_78.exception;
  if (local_78.exception != (Exception *)0x0) {
    local_78.exception = (Exception *)0x0;
    sStack_70 = 0;
    (**local_68->_vptr_ArrayDisposer)(local_68,FVar8.exception,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String createNamedTemporary(
      PathPtr finalName, WriteMode mode, Function<int(StringPtr)> tryCreate) const {
    // Create a temporary file which will eventually replace `finalName`.
    //
    // Calls `tryCreate` to actually create the temporary, passing in the desired path. tryCreate()
    // is expected to behave like a syscall, returning a negative value and setting `errno` on
    // error. tryCreate() MUST fail with EEXIST if the path exists -- this is not checked in
    // advance, since it needs to be checked atomically. In the case of EEXIST, tryCreate() will
    // be called again with a new path.
    //
    // Returns the temporary path that succeeded.

    if (finalName.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self");
    }

    static uint counter = 0;
    static const pid_t pid = getpid();
    String pathPrefix;
    if (finalName.size() > 1) {
      pathPrefix = kj::str(finalName.parent(), '/');
    }
    auto path = kj::str(pathPrefix, HIDDEN_PREFIX, pid, '.', counter++, '.',
                        finalName.basename()[0], ".partial");

    KJ_SYSCALL_HANDLE_ERRORS(tryCreate(path)) {
      case EEXIST:
        return createNamedTemporary(finalName, mode, kj::mv(tryCreate));
      case ENOENT:
        if (has(mode, WriteMode::CREATE_PARENT) && finalName.size() > 1 &&
            tryMkdir(finalName.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                         WriteMode::CREATE_PARENT, true)) {
          // Retry, but make sure we don't try to create the parent again.
          mode = mode - WriteMode::CREATE_PARENT;
          return createNamedTemporary(finalName, mode, kj::mv(tryCreate));
        }
        KJ_FALLTHROUGH;
      default:
        KJ_FAIL_SYSCALL("create(path)", error, path);
    }

    return kj::mv(path);
  }